

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

void __thiscall BVFixed::ComplimentAll(BVFixed *this)

{
  BVIndex BVar1;
  BVIndex i;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    BVar1 = WordCount(this);
    if (BVar1 <= uVar2) break;
    this[uVar2 + 1] = (BVFixed)~(ulong)this[uVar2 + 1];
    uVar2 = uVar2 + 1;
  }
  ClearEnd(this);
  return;
}

Assistant:

void
BVFixed::ComplimentAll()
{
    for(BVIndex i=0; i < this->WordCount(); i++)
    {
        this->data[i].ComplimentAll();
    }

    ClearEnd();
}